

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall cmake::RunCheckForUnusedVariables(cmake *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  bool bVar3;
  ostringstream msg;
  string local_210;
  Snapshot local_1f0;
  cmListFileBacktrace local_1d8;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Manually-specified variables were not used by the project:",0x3a)
  ;
  p_Var2 = (this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var1) {
    bVar3 = false;
    do {
      while ((char)p_Var2[2]._M_color == _S_red) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n  ",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
        bVar3 = true;
        if ((_Rb_tree_header *)p_Var2 == p_Var1) goto LAB_00330f90;
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var1);
    if (bVar3) {
LAB_00330f90:
      std::__cxx11::stringbuf::str();
      cmState::Snapshot::Snapshot(&local_1f0,(cmState *)0x0,(PositionType)ZEXT816(0));
      local_1d8.Snapshot.Position.Position = local_1f0.Position.Position;
      local_1d8.Snapshot.State = local_1f0.State;
      local_1d8.Snapshot.Position.Tree = local_1f0.Position.Tree;
      local_1d8.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
      super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d8.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
      super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1d8.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
      super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      IssueMessage(this,WARNING,&local_210,&local_1d8);
      std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
                (&local_1d8.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void cmake::RunCheckForUnusedVariables()
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  bool haveUnused = false;
  std::ostringstream msg;
  msg << "Manually-specified variables were not used by the project:";
  for(std::map<std::string, bool>::const_iterator
        it = this->UsedCliVariables.begin();
      it != this->UsedCliVariables.end(); ++it)
    {
    if(!it->second)
      {
      haveUnused = true;
      msg << "\n  " << it->first;
      }
    }
  if(haveUnused)
    {
    this->IssueMessage(cmake::WARNING, msg.str());
    }
#endif
}